

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

bool __thiscall
miniros::MasterLink::getParamImpl<int>
          (MasterLink *this,string *key,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *map,bool cached)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  mapped_type_conflict2 *pmVar5;
  RpcValue xml_value;
  RpcValue local_48;
  XmlRpcValue local_38;
  
  local_48._type = TypeInvalid;
  local_48._value.asDouble = 0.0;
  bVar1 = getParamImpl(this,key,&local_48,cached);
  if (bVar1 && local_48._type == TypeStruct) {
    iVar3 = XmlRpc::XmlRpcValue::begin_abi_cxx11_(&local_48);
    while( true ) {
      iVar4 = XmlRpc::XmlRpcValue::end_abi_cxx11_(&local_48);
      bVar1 = iVar3._M_node == iVar4._M_node;
      if ((bVar1) || (2 < iVar3._M_node[2]._M_color - _S_black)) break;
      XmlRpc::XmlRpcValue::XmlRpcValue(&local_38,(XmlRpcValue *)(iVar3._M_node + 2));
      iVar2 = xml_cast<int>(&local_38);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](map,(key_type *)(iVar3._M_node + 1));
      *pmVar5 = iVar2;
      XmlRpc::XmlRpcValue::~XmlRpcValue(&local_38);
      iVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar3._M_node);
    }
  }
  else {
    bVar1 = false;
  }
  XmlRpc::XmlRpcValue::~XmlRpcValue(&local_48);
  return bVar1;
}

Assistant:

bool MasterLink::getParamImpl(const std::string& key, std::map<std::string, T>& map, bool cached)
{
  RpcValue xml_value;
  if (!getParamImpl(key, xml_value, cached)) {
    return false;
  }

  // Make sure it's a struct type
  if (xml_value.getType() != RpcValue::TypeStruct) {
    return false;
  }

  // Fill the map with stuff
  for (auto it = xml_value.begin(); it != xml_value.end(); ++it) {
    // Make sure this element is the right type
    if (!xml_castable<T>(it->second.getType())) {
      return false;
    }
    // Store the element
    map[it->first] = xml_cast<T>(it->second);
  }

  return true;
}